

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_NtkPrintPaths(Acb_Ntk_t *p)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  uint uVar3;
  int iVar4;
  uint local_14;
  int iObj;
  Acb_Ntk_t *p_local;
  
  for (local_14 = 1; iVar1 = Vec_StrSize(&p->vObjType), (int)local_14 < iVar1;
      local_14 = local_14 + 1) {
    AVar2 = Acb_ObjType(p,local_14);
    if (AVar2 != ABC_OPER_NONE) {
      printf("Obj = %5d :   ",(ulong)local_14);
      uVar3 = Acb_ObjLevelD(p,local_14);
      printf("LevelD = %5d  ",(ulong)uVar3);
      uVar3 = Acb_ObjLevelR(p,local_14);
      printf("LevelR = %5d    ",(ulong)uVar3);
      uVar3 = Acb_ObjPathD(p,local_14);
      printf("PathD = %5d  ",(ulong)uVar3);
      uVar3 = Acb_ObjPathR(p,local_14);
      printf("PathR = %5d    ",(ulong)uVar3);
      iVar1 = Acb_ObjPathD(p,local_14);
      iVar4 = Acb_ObjPathR(p,local_14);
      printf("Paths = %5d  ",(ulong)(uint)(iVar1 * iVar4));
      printf("\n");
    }
  }
  return;
}

Assistant:

void Acb_NtkPrintPaths( Acb_Ntk_t * p )
{
    int iObj;
    Acb_NtkForEachObj( p, iObj )
    {
        printf( "Obj = %5d :   ",   iObj );
        printf( "LevelD = %5d  ",   Acb_ObjLevelD(p, iObj) );
        printf( "LevelR = %5d    ", Acb_ObjLevelR(p, iObj) );
        printf( "PathD = %5d  ",    Acb_ObjPathD(p, iObj) );
        printf( "PathR = %5d    ",  Acb_ObjPathR(p, iObj) );
        printf( "Paths = %5d  ",    Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj) );
        printf( "\n" );
    }
}